

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

Am_Constraint * __thiscall
Web_Constraint::Create(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  Am_Web_Create_Proc *pAVar1;
  bool bVar2;
  Am_Web_Data *this_00;
  
  pAVar1 = this->owner->create_proc;
  if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar2 = (*pAVar1)(new_slot), bVar2)) {
    this_00 = (Am_Web_Data *)operator_new(0x70);
    Am_Web_Data::Am_Web_Data(this_00,this->owner);
    return &(this_00->interface).super_Am_Constraint;
  }
  return (Am_Constraint *)0x0;
}

Assistant:

Am_Constraint *
Web_Constraint::Create(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot))
    return *(new Am_Web_Data(owner));
  return nullptr;
}